

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O2

void get_max_cover_static2<64ul,7>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,bool print_progress)

{
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  ostream *poVar4;
  long lVar5;
  size_t j;
  array<unsigned_long,_7UL> *collection;
  pointer paVar6;
  size_t N;
  size_type n;
  pair<unsigned_long,_std::vector<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>_>
  local_128;
  size_type local_108;
  size_t progress;
  size_t this_count;
  vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> binary_sets;
  collection end;
  collection indices;
  anon_class_56_7_64ceefa5 local_68;
  
  BitSetsFromSets<64ul>(&binary_sets,sets,names);
  n = ((long)(sets->
             super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(sets->
            super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  N = nchoosek(n,7);
  puVar1 = (_begin->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (_end->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    indices._M_elems[lVar5] = puVar1[lVar5];
    end._M_elems[lVar5] = puVar2[lVar5];
  }
  local_68.indices = &indices;
  local_68.this_count = &this_count;
  local_68.progress = &progress;
  local_68.n = &n;
  local_68.end = &end;
  local_128.first = 0;
  local_128.second.
  super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.second.
  super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.second.
  super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_count = 0;
  progress = 0;
  local_68.best = &local_128;
  local_108 = (names->_M_h)._M_element_count;
  local_68.binary_sets = &binary_sets;
  ProgressIndicator<std::exception,get_max_cover_static2<64ul,7>(std::vector<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>const&,std::unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool)::_lambda()_1_,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long_const&>
            ("\r%zu/%zu @ %zu/%zu",print_progress,&local_68,&(local_68.best)->first,&local_108,
             local_68.progress,&N);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar4 = std::operator<<(poVar4,'/');
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  paVar3 = local_128.second.
           super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar6 = local_128.second.
                super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar6 != paVar3; paVar6 = paVar6 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    for (lVar5 = 1; lVar5 != 7; lVar5 = lVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,'\t');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::
  _Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>::
  ~_Vector_base(&local_128.second.
                 super__Vector_base<std::array<unsigned_long,_7UL>,_std::allocator<std::array<unsigned_long,_7UL>_>_>
               );
  std::_Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::~_Vector_base
            (&binary_sets.super__Vector_base<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>
            );
  return;
}

Assistant:

void get_max_cover_static2(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, bool print_progress = false)
{
    const std::vector<std::bitset<n_entities>> binary_sets = BitSetsFromSets<n_entities>(sets, names);
    const auto n = sets.size();
    const auto N = nchoosek(n, k);
    
    typedef std::array<size_t, k> collection;
    
    collection indices, end;

    for (size_t i = 0; i < k; ++i)
    {
        indices[i] = _begin[i];
        end[i] = _end[i];
    }

    std::pair<size_t, std::vector<collection>> best;
    best.first = 0; best.second.clear();
    size_t this_count = 0;
    size_t progress = 0;
    ProgressIndicator("\r%zu/%zu @ %zu/%zu", print_progress, [&]()
    {
        int i;
        int b = 0; // first index where 'indices' and 'end' differ
        for (; b < k; ++b)
            if (indices[b] != end[b])
                break;

        // https://docs.python.org/2/library/itertools.html#itertools.combinations
        while (running && b < k)
        {
            //for (auto x : indices)
            //    std::cerr << x << '\t';
            //std::cerr << std::endl;

            this_count = sets_union(binary_sets, indices);
            if (this_count > best.first)
            {
                best.second.clear();
                best.second.push_back(indices);
                best.first = this_count;
            }
            else if (this_count == best.first)
            {
                best.second.push_back(indices);
            }
            ++progress;

            for (i = k - 1; i >= b; --i)
                if (indices[i] != (i + n) - k)
                    break;

            if (i < b)
                break;

            indices[i] += 1;
            for (size_t j = i + 1; j < k; ++j)
                indices[j] = indices[j - 1] + 1;
            if (i == b) // recalculates place of first differ
                for (; b < k; ++b)
                    if (indices[b] != end[b])
                        break;
        }
    }, best.first, names.size(), progress, N);
    
    std::cout << best.first << '/' << names.size() << std::endl;
    for (const auto& collection : best.second)
    {
        std::cout << collection[0];
        for (size_t j = 1; j < k; ++j)
        {
            std::cout << '\t' << collection[j];
        }
        std::cout << '\n';
    }
}